

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha512.cpp
# Opt level: O0

void __thiscall CSHA512::Finalize(CSHA512 *this,uchar *hash)

{
  long lVar1;
  size_t in_RSI;
  uchar *in_RDI;
  long in_FS_OFFSET;
  uchar sizedesc [16];
  uint64_t in_stack_ffffffffffffffc8;
  uchar *data;
  CSHA512 *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (CSHA512 *)0x0;
  data = in_RDI;
  WriteBE64(in_RDI,in_stack_ffffffffffffffc8);
  Write(this_00,data,in_RSI);
  Write(this_00,data,in_RSI);
  WriteBE64(in_RDI,in_stack_ffffffffffffffc8);
  WriteBE64(in_RDI,in_stack_ffffffffffffffc8);
  WriteBE64(in_RDI,in_stack_ffffffffffffffc8);
  WriteBE64(in_RDI,in_stack_ffffffffffffffc8);
  WriteBE64(in_RDI,in_stack_ffffffffffffffc8);
  WriteBE64(in_RDI,in_stack_ffffffffffffffc8);
  WriteBE64(in_RDI,in_stack_ffffffffffffffc8);
  WriteBE64(in_RDI,in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CSHA512::Finalize(unsigned char hash[OUTPUT_SIZE])
{
    static const unsigned char pad[128] = {0x80};
    unsigned char sizedesc[16] = {0x00};
    WriteBE64(sizedesc + 8, bytes << 3);
    Write(pad, 1 + ((239 - (bytes % 128)) % 128));
    Write(sizedesc, 16);
    WriteBE64(hash, s[0]);
    WriteBE64(hash + 8, s[1]);
    WriteBE64(hash + 16, s[2]);
    WriteBE64(hash + 24, s[3]);
    WriteBE64(hash + 32, s[4]);
    WriteBE64(hash + 40, s[5]);
    WriteBE64(hash + 48, s[6]);
    WriteBE64(hash + 56, s[7]);
}